

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytevector.c
# Opt level: O2

sexp_conflict str2utf16(sexp_conflict ctx,char *s,int len,sexp_conflict endianness)

{
  ushort uVar1;
  int iVar2;
  sexp_conflict psVar3;
  ulong uVar4;
  long lVar5;
  ushort *puVar6;
  uchar *puVar7;
  ushort *puVar8;
  long lVar9;
  uchar *puVar10;
  ushort *puVar11;
  
  puVar7 = (uchar *)(s + len);
  lVar9 = 0;
  for (puVar10 = (uchar *)s; puVar10 < puVar7; puVar10 = puVar10 + iVar2) {
    iVar2 = sexp_utf8_initial_byte_count(*puVar10);
    lVar9 = lVar9 + (ulong)(iVar2 == 4) + 1;
  }
  psVar3 = (sexp_conflict)sexp_make_bytes_op(ctx,0,2,lVar9 * 4 + 1,0x43e);
  if ((((ulong)psVar3 & 3) == 0) && (psVar3->tag == 8)) {
    puVar11 = (ushort *)((long)&psVar3->value + 8);
    puVar8 = puVar11;
    for (; s < puVar7; s = (char *)((uchar *)s + iVar2)) {
      iVar2 = sexp_utf8_initial_byte_count(*s);
      uVar4 = decode_utf8((uchar *)s,iVar2);
      uVar1 = (ushort)uVar4;
      if (iVar2 == 4) {
        puVar6 = puVar8 + 2;
        puVar8[1] = uVar1 & 0x3ff | 0xdc00;
        uVar1 = (short)(uVar4 >> 10) + 0xd7c0;
      }
      else {
        puVar6 = puVar8 + 1;
      }
      *puVar8 = uVar1;
      puVar8 = puVar6;
    }
    if ((((ctx->value).type.setters)->value).type.slots != endianness) {
      lVar5 = 0;
      if (lVar9 < 1) {
        lVar9 = lVar5;
      }
      for (; lVar9 != lVar5; lVar5 = lVar5 + 1) {
        puVar8 = puVar11 + lVar5;
        *puVar8 = *puVar8 << 8 | *puVar8 >> 8;
      }
    }
  }
  return psVar3;
}

Assistant:

sexp str2utf16(sexp ctx, char* s, int len, sexp endianness) {
  unsigned char *p = (unsigned char*) s, *q;
  uint16_t *utf16, hi, lo;
  sexp_sint_t utf16_len, ch_len, ch, i;
  sexp res;
  q = p + len;
  for (utf16_len=0; p<q; ++utf16_len) {
    ch_len = sexp_utf8_initial_byte_count(*p);
    if (ch_len == 4) ++utf16_len;   /* surrogate */
    p += ch_len;
  }
  res = sexp_make_bytes(ctx, sexp_make_fixnum(utf16_len*2), SEXP_VOID);
  if (!sexp_bytesp(res)) return res;
  utf16 = (uint16_t*)sexp_bytes_data(res);
  for (p=(unsigned char*)s; p<q; ) {
    ch_len = sexp_utf8_initial_byte_count(*p);
    ch = decode_utf8(p, ch_len);
    if (ch_len == 4) {
      hi = (0xD800 - (0x10000 >> 10) + ((ch) >> 10));
      lo = (0xDC00 + ((ch) & 0x3FF));
      (*utf16++) = hi;
      (*utf16++) = lo;
    } else {
      (*utf16++) = (uint16_t)ch;
    }
    p += ch_len;
  }
  if (endianness != sexp_global(ctx, SEXP_G_ENDIANNESS)) {
    utf16 = (uint16_t*)sexp_bytes_data(res);
    for (i=0; i<utf16_len; ++i) {
      utf16[i] = sexp_swap_u16(utf16[i]);
    }
  }
  return res;
}